

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O1

IntBounds *
IntBounds::Merge(Value *bounds0Value,IntBounds *bounds0,Value *bounds1Value,IntBounds *bounds1)

{
  JitArenaAllocator *allocator;
  code *pcVar1;
  int32 lowerBound;
  int32 upperBound;
  bool bVar2;
  undefined4 *puVar3;
  IntBounds *mergedBounds;
  IntConstantBounds local_38;
  
  if (bounds0Value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0x231,"(bounds0Value)","bounds0Value");
    if (!bVar2) goto LAB_00568530;
    *puVar3 = 0;
  }
  Verify(bounds0);
  if (bounds1Value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0x233,"(bounds1Value)","bounds1Value");
    if (!bVar2) {
LAB_00568530:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  Verify(bounds1);
  if (bounds0 != bounds1) {
    allocator = (bounds0->relativeLowerBounds).
                super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                .alloc;
    lowerBound = bounds1->constantLowerBound;
    if (bounds0->constantLowerBound < bounds1->constantLowerBound) {
      lowerBound = bounds0->constantLowerBound;
    }
    upperBound = bounds1->constantUpperBound;
    if (bounds1->constantUpperBound < bounds0->constantUpperBound) {
      upperBound = bounds0->constantUpperBound;
    }
    IntConstantBounds::IntConstantBounds(&local_38,lowerBound,upperBound);
    bVar2 = false;
    if (bounds0->wasConstantUpperBoundEstablishedExplicitly == true) {
      bVar2 = bounds1->wasConstantUpperBoundEstablishedExplicitly;
    }
    mergedBounds = New(&local_38,bVar2,allocator);
    MergeBoundSets<true>(bounds0Value,bounds0,bounds1Value,bounds1,mergedBounds);
    MergeBoundSets<false>(bounds0Value,bounds0,bounds1Value,bounds1,mergedBounds);
    Verify(mergedBounds);
    bounds0 = mergedBounds;
  }
  return bounds0;
}

Assistant:

const IntBounds *IntBounds::Merge(
    const Value *const bounds0Value,
    const IntBounds *const bounds0,
    const Value *const bounds1Value,
    const IntBounds *const bounds1)
{
    Assert(bounds0Value);
    bounds0->Verify();
    Assert(bounds1Value);
    bounds1->Verify();

    if(bounds0 == bounds1)
        return bounds0;

    JitArenaAllocator *const allocator = bounds0->relativeLowerBounds.GetAllocator();
    IntBounds *const mergedBounds =
        New(IntConstantBounds(
                min(bounds0->constantLowerBound, bounds1->constantLowerBound),
                max(bounds0->constantUpperBound, bounds1->constantUpperBound)),
            bounds0->WasConstantUpperBoundEstablishedExplicitly() && bounds1->WasConstantUpperBoundEstablishedExplicitly(),
            allocator);
    MergeBoundSets<true>(bounds0Value, bounds0, bounds1Value, bounds1, mergedBounds);
    MergeBoundSets<false>(bounds0Value, bounds0, bounds1Value, bounds1, mergedBounds);
    if(mergedBounds->HasBounds())
    {
        mergedBounds->Verify();
        return mergedBounds;
    }
    mergedBounds->Delete();
    return nullptr;
}